

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerArraySegmentVars(Lowerer *this,Instr *arrayInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  HelperCallOpnd *this_00;
  Opnd *pOVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  LowererMD *this_01;
  
  this_00 = IR::HelperCallOpnd::New(HelperArraySegmentVars,this->m_func);
  this_01 = &this->m_lowererMD;
  pOVar4 = IR::Instr::UnlinkSrc2(arrayInstr);
  pIVar5 = LowererMD::LoadHelperArgument(this_01,arrayInstr,pOVar4);
  pOVar4 = IR::Instr::UnlinkSrc1(arrayInstr);
  LowererMD::LoadHelperArgument(this_01,arrayInstr,pOVar4);
  arrayInstr->m_opcode = Call;
  if (arrayInstr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_0059f2b3;
    *puVar6 = 0;
  }
  func = arrayInstr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_0059f2b3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar3 = (this_00->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
    bVar3 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar3 | 2;
  arrayInstr->m_src1 = &this_00->super_Opnd;
  LowererMD::LowerCall(this_01,arrayInstr,0);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerArraySegmentVars(IR::Instr *arrayInstr)
{
    IR::Instr * instrPrev;
    IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperArraySegmentVars, m_func);

    instrPrev = m_lowererMD.LoadHelperArgument(arrayInstr, arrayInstr->UnlinkSrc2());
    m_lowererMD.LoadHelperArgument(arrayInstr, arrayInstr->UnlinkSrc1());

    arrayInstr->m_opcode = Js::OpCode::Call;
    arrayInstr->SetSrc1(opndHelper);

    m_lowererMD.LowerCall(arrayInstr, 0);

    return instrPrev;
}